

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall
QWidgetTextControlPrivate::repaintOldAndNewSelection
          (QWidgetTextControlPrivate *this,QTextCursor *oldSelection)

{
  QWidgetTextControl *this_00;
  char cVar1;
  int iVar2;
  int iVar3;
  MoveMode MVar4;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  QRectF QStack_98;
  QTextCursor differenceSelection;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetTextControl **)&this->field_0x8;
  cVar1 = QTextCursor::hasSelection();
  if (cVar1 != '\0') {
    cVar1 = QTextCursor::hasSelection();
    if (cVar1 != '\0') {
      lVar5 = QTextCursor::currentFrame();
      lVar6 = QTextCursor::currentFrame();
      if (lVar5 == lVar6) {
        cVar1 = QTextCursor::hasComplexSelection();
        if (cVar1 == '\0') {
          cVar1 = QTextCursor::hasComplexSelection();
          if (cVar1 == '\0') {
            iVar2 = QTextCursor::anchor();
            iVar3 = QTextCursor::anchor();
            if (iVar2 == iVar3) {
              _differenceSelection = &DAT_aaaaaaaaaaaaaaaa;
              QTextCursor::QTextCursor(&differenceSelection,this->doc);
              MVar4 = QTextCursor::position();
              iVar2 = (int)&differenceSelection;
              QTextCursor::setPosition(iVar2,MVar4);
              MVar4 = QTextCursor::position();
              QTextCursor::setPosition(iVar2,MVar4);
              QWidgetTextControl::selectionRect(&local_58,this_00,&differenceSelection);
              QWidgetTextControl::updateRequest(this_00,&local_58);
              QTextCursor::~QTextCursor(&differenceSelection);
              goto LAB_0047a933;
            }
          }
        }
      }
    }
  }
  cVar1 = QTextCursor::isNull();
  if (cVar1 == '\0') {
    QWidgetTextControl::selectionRect((QRectF *)&differenceSelection,this_00,oldSelection);
    cursorRectPlusUnicodeDirectionMarkers(&QStack_98,this,oldSelection);
    QRectF::operator|(&local_58,(QRectF *)&differenceSelection);
    QWidgetTextControl::updateRequest(this_00,&local_58);
  }
  QWidgetTextControl::selectionRect((QRectF *)&differenceSelection,this_00);
  cursorRectPlusUnicodeDirectionMarkers(&QStack_98,this,&this->cursor);
  QRectF::operator|(&local_58,(QRectF *)&differenceSelection);
  QWidgetTextControl::updateRequest(this_00,&local_58);
LAB_0047a933:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::repaintOldAndNewSelection(const QTextCursor &oldSelection)
{
    Q_Q(QWidgetTextControl);
    if (cursor.hasSelection()
        && oldSelection.hasSelection()
        && cursor.currentFrame() == oldSelection.currentFrame()
        && !cursor.hasComplexSelection()
        && !oldSelection.hasComplexSelection()
        && cursor.anchor() == oldSelection.anchor()
        ) {
        QTextCursor differenceSelection(doc);
        differenceSelection.setPosition(oldSelection.position());
        differenceSelection.setPosition(cursor.position(), QTextCursor::KeepAnchor);
        emit q->updateRequest(q->selectionRect(differenceSelection));
    } else {
        if (!oldSelection.isNull())
            emit q->updateRequest(q->selectionRect(oldSelection) | cursorRectPlusUnicodeDirectionMarkers(oldSelection));
        emit q->updateRequest(q->selectionRect() | cursorRectPlusUnicodeDirectionMarkers(cursor));
    }
}